

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O1

void pdfloat_symbol(t_pdfloat *x,t_symbol *s)

{
  _outlet *x_00;
  float f;
  double dVar1;
  char *str_end;
  char *local_18;
  
  local_18 = (char *)0x0;
  dVar1 = strtod(s->s_name,&local_18);
  f = (float)dVar1;
  if (((f == 0.0) && (!NAN(f))) && (s->s_name == local_18)) {
    pd_error(x,"couldn\'t convert %s to float");
    return;
  }
  x_00 = (x->x_obj).te_outlet;
  x->x_f = f;
  outlet_float(x_00,f);
  return;
}

Assistant:

static void pdfloat_symbol(t_pdfloat *x, t_symbol *s)
{
    t_float f = 0.0f;
    char *str_end = NULL;
    f = strtod(s->s_name, &str_end);
    if (f == 0 && s->s_name == str_end)
        pd_error(x, "couldn't convert %s to float", s->s_name);
    else outlet_float(x->x_obj.ob_outlet, x->x_f = f);
}